

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_selection.cpp
# Opt level: O0

void mocker::anon_unknown_0::genFunction
               (Section *text,FuncSelectionContext *ctx,FunctionModule *func)

{
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  FunctionModule *pFVar2;
  FuncSelectionContext *pFVar3;
  bool bVar4;
  int iVar5;
  string *psVar6;
  shared_ptr<mocker::nasm::Register> *psVar7;
  shared_ptr<mocker::nasm::Register> *args_1;
  element_type *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  const_reference args_1_00;
  element_type *peVar10;
  BasicBlockList *pBVar11;
  reference this_00;
  InstList *this_01;
  reference v;
  element_type *this_02;
  shared_ptr<mocker::ir::Addr> *addr;
  shared_ptr<mocker::nasm::Register> *local_450;
  _Self local_3a0;
  const_iterator end;
  const_iterator iter;
  string local_388 [32];
  undefined1 local_368 [8];
  shared_ptr<mocker::nasm::Register> addrReg;
  undefined1 local_338 [8];
  shared_ptr<mocker::nasm::LabelAddr> labelAddr;
  shared_ptr<mocker::ir::Reg> *reg_5;
  iterator __end2_2;
  iterator __begin2_2;
  RegSet *__range2_2;
  undefined1 local_2f8 [8];
  shared_ptr<mocker::ir::Reg> reg_4;
  shared_ptr<mocker::ir::Addr> *operand;
  iterator __end4;
  iterator __begin4;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  *__range4;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  operands;
  undefined1 local_298 [8];
  shared_ptr<mocker::ir::Reg> reg_3;
  shared_ptr<mocker::ir::Store> p;
  shared_ptr<mocker::ir::IRInst> *inst;
  const_iterator __end3;
  const_iterator __begin3;
  InstList *__range3;
  BasicBlock *bb;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  BasicBlockList *__range2_1;
  RegSet globalVars;
  shared_ptr<mocker::nasm::MemoryAddr> local_1e8;
  undefined1 local_1d8 [8];
  shared_ptr<mocker::nasm::Register> dest;
  undefined1 local_1a8 [8];
  shared_ptr<mocker::ir::Reg> reg_2;
  size_t i_1;
  undefined1 local_180 [16];
  undefined1 local_170 [16];
  string local_160;
  undefined1 local_140 [8];
  shared_ptr<mocker::ir::Reg> reg_1;
  size_t i;
  shared_ptr<mocker::nasm::Register> *local_120;
  undefined1 local_118 [32];
  shared_ptr<mocker::nasm::Register> local_f8;
  shared_ptr<mocker::nasm::Register> local_e8;
  shared_ptr<mocker::nasm::Register> local_d8;
  shared_ptr<mocker::nasm::Register> local_c8;
  shared_ptr<mocker::nasm::Register> local_b8;
  allocator<char> local_a1;
  string local_a0 [32];
  undefined1 local_80 [8];
  shared_ptr<mocker::nasm::Register> bak;
  shared_ptr<mocker::nasm::Register> *reg;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  *__range2;
  string local_40;
  FunctionModule *local_20;
  FunctionModule *func_local;
  FuncSelectionContext *ctx_local;
  Section *text_local;
  
  local_20 = func;
  func_local = (FunctionModule *)ctx;
  ctx_local = (FuncSelectionContext *)text;
  psVar6 = ir::FunctionModule::getIdentifier_abi_cxx11_(func);
  renameIdentifier(&local_40,psVar6);
  nasm::Section::labelThisLine(text,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  pFVar3 = ctx_local;
  psVar7 = nasm::rbp();
  nasm::Section::emplaceInst<mocker::nasm::Push,std::shared_ptr<mocker::nasm::Register>const&>
            ((Section *)pFVar3,psVar7);
  pFVar3 = ctx_local;
  psVar7 = nasm::rbp();
  args_1 = nasm::rsp();
  nasm::Section::
  emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Register>const&>
            ((Section *)pFVar3,psVar7,args_1);
  __end2 = std::
           vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
           ::begin((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    *)(anonymous_namespace)::CalleeSave);
  reg = (shared_ptr<mocker::nasm::Register> *)
        std::
        vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ::end((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
               *)(anonymous_namespace)::CalleeSave);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::shared_ptr<mocker::nasm::Register>_*,_std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>
                                     *)&reg), bVar4) {
    bak.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         __gnu_cxx::
         __normal_iterator<const_std::shared_ptr<mocker::nasm::Register>_*,_std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>
         ::operator*(&__end2);
    this = std::
           __shared_ptr_access<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)bak.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
    psVar6 = nasm::Register::getIdentifier_abi_cxx11_(this);
    bVar4 = std::operator==(psVar6,"rbp");
    pFVar2 = func_local;
    if (bVar4) {
      FuncSelectionContext::setPRegAddr
                ((FuncSelectionContext *)func_local,
                 (shared_ptr<mocker::nasm::Register> *)
                 bak.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi,
                 (shared_ptr<mocker::nasm::Register> *)
                 bak.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_a0,"",&local_a1);
      FuncSelectionContext::newVirtualReg((FuncSelectionContext *)local_80,&pFVar2->identifier);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator(&local_a1);
      nasm::Section::
      emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Register>const&>
                ((Section *)ctx_local,(shared_ptr<mocker::nasm::Register> *)local_80,
                 (shared_ptr<mocker::nasm::Register> *)
                 bak.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      FuncSelectionContext::setPRegAddr
                ((FuncSelectionContext *)func_local,
                 (shared_ptr<mocker::nasm::Register> *)
                 bak.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi,(shared_ptr<mocker::nasm::Register> *)local_80);
      std::shared_ptr<mocker::nasm::Register>::~shared_ptr
                ((shared_ptr<mocker::nasm::Register> *)local_80);
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<mocker::nasm::Register>_*,_std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>
    ::operator++(&__end2);
  }
  if (((anonymous_namespace)::
       genFunction(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,mocker::ir::FunctionModule_const&)
       ::ParamRegs == '\0') &&
     (iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   genFunction(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,mocker::ir::FunctionModule_const&)
                                   ::ParamRegs), iVar5 != 0)) {
    local_120 = (shared_ptr<mocker::nasm::Register> *)local_118;
    psVar7 = nasm::rdi();
    std::shared_ptr<mocker::nasm::Register>::shared_ptr
              ((shared_ptr<mocker::nasm::Register> *)local_118,psVar7);
    local_120 = (shared_ptr<mocker::nasm::Register> *)(local_118 + 0x10);
    psVar7 = nasm::rsi();
    std::shared_ptr<mocker::nasm::Register>::shared_ptr
              ((shared_ptr<mocker::nasm::Register> *)(local_118 + 0x10),psVar7);
    local_120 = &local_f8;
    psVar7 = nasm::rdx();
    std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_f8,psVar7);
    local_120 = &local_e8;
    psVar7 = nasm::rcx();
    std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_e8,psVar7);
    local_120 = &local_d8;
    psVar7 = nasm::r8();
    std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_d8,psVar7);
    local_120 = &local_c8;
    psVar7 = nasm::r9();
    std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_c8,psVar7);
    local_b8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_118;
    local_b8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6;
    std::allocator<std::shared_ptr<mocker::nasm::Register>_>::allocator
              ((allocator<std::shared_ptr<mocker::nasm::Register>_> *)((long)&i + 7));
    __l._M_len = (size_type)
                 local_b8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
    __l._M_array = (iterator)
                   local_b8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
    std::
    vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    ::vector(&genFunction::ParamRegs,__l,
             (allocator<std::shared_ptr<mocker::nasm::Register>_> *)((long)&i + 7));
    std::allocator<std::shared_ptr<mocker::nasm::Register>_>::~allocator
              ((allocator<std::shared_ptr<mocker::nasm::Register>_> *)((long)&i + 7));
    local_450 = &local_b8;
    do {
      local_450 = local_450 + -1;
      std::shared_ptr<mocker::nasm::Register>::~shared_ptr(local_450);
    } while (local_450 != (shared_ptr<mocker::nasm::Register> *)local_118);
    __cxa_atexit(std::
                 vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 ::~vector,&genFunction::ParamRegs,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         genFunction(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,mocker::ir::FunctionModule_const&)
                         ::ParamRegs);
  }
  reg_1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while( true ) {
    _Var1._M_pi = reg_1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    bVar4 = false;
    if (reg_1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi <
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6) {
      pvVar8 = ir::FunctionModule::getArgs_abi_cxx11_(local_20);
      p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(pvVar8);
      bVar4 = _Var1._M_pi < p_Var9;
    }
    if (!bVar4) break;
    std::__cxx11::to_string
              ((string *)(local_170 + 0x10),
               (unsigned_long)
               reg_1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    std::make_shared<mocker::ir::Reg,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
    std::__cxx11::string::~string((string *)(local_170 + 0x10));
    pFVar2 = func_local;
    peVar10 = std::__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_140);
    ir::Reg::getIdentifier_abi_cxx11_(peVar10);
    FuncSelectionContext::newVirtualReg((FuncSelectionContext *)local_170,&pFVar2->identifier);
    FuncSelectionContext::setIrRegAddr
              ((FuncSelectionContext *)pFVar2,(shared_ptr<mocker::ir::Reg> *)local_140,
               (shared_ptr<mocker::nasm::Register> *)local_170);
    std::shared_ptr<mocker::nasm::Register>::~shared_ptr
              ((shared_ptr<mocker::nasm::Register> *)local_170);
    pFVar3 = ctx_local;
    pFVar2 = func_local;
    std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
              ((shared_ptr<mocker::ir::Addr> *)&i_1,(shared_ptr<mocker::ir::Reg> *)local_140);
    FuncSelectionContext::getIrAddr
              ((FuncSelectionContext *)local_180,(shared_ptr<mocker::ir::Addr> *)pFVar2);
    args_1_00 = std::
                vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ::operator[](&genFunction::ParamRegs,
                             (size_type)
                             reg_1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Addr>,std::shared_ptr<mocker::nasm::Register>const&>
              ((Section *)pFVar3,(shared_ptr<mocker::nasm::Addr> *)local_180,args_1_00);
    std::shared_ptr<mocker::nasm::Addr>::~shared_ptr((shared_ptr<mocker::nasm::Addr> *)local_180);
    std::shared_ptr<mocker::ir::Addr>::~shared_ptr((shared_ptr<mocker::ir::Addr> *)&i_1);
    std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_140);
    reg_1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((long)&(reg_1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->_vptr__Sp_counted_base + 1);
  }
  reg_2.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6;
  while( true ) {
    _Var1._M_pi = reg_2.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    pvVar8 = ir::FunctionModule::getArgs_abi_cxx11_(local_20);
    p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(pvVar8);
    if (p_Var9 <= _Var1._M_pi) break;
    std::__cxx11::to_string
              ((string *)
               &dest.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               (unsigned_long)
               reg_2.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    std::make_shared<mocker::ir::Reg,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
    std::__cxx11::string::~string
              ((string *)
               &dest.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    pFVar2 = func_local;
    peVar10 = std::__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_1a8);
    ir::Reg::getIdentifier_abi_cxx11_(peVar10);
    FuncSelectionContext::newVirtualReg((FuncSelectionContext *)local_1d8,&pFVar2->identifier);
    FuncSelectionContext::setIrRegAddr
              ((FuncSelectionContext *)func_local,(shared_ptr<mocker::ir::Reg> *)local_1a8,
               (shared_ptr<mocker::nasm::Register> *)local_1d8);
    pFVar3 = ctx_local;
    psVar7 = nasm::rbp();
    globalVars._M_h._M_single_bucket =
         (__node_base_ptr)
         ((long)reg_2.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi * 8 + -0x20);
    std::
    make_shared<mocker::nasm::MemoryAddr,std::shared_ptr<mocker::nasm::Register>const&,unsigned_long>
              ((shared_ptr<mocker::nasm::Register> *)&local_1e8,(unsigned_long *)psVar7);
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::MemoryAddr>>
              ((Section *)pFVar3,(shared_ptr<mocker::nasm::Register> *)local_1d8,&local_1e8);
    std::shared_ptr<mocker::nasm::MemoryAddr>::~shared_ptr(&local_1e8);
    std::shared_ptr<mocker::nasm::Register>::~shared_ptr
              ((shared_ptr<mocker::nasm::Register> *)local_1d8);
    std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_1a8);
    reg_2.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((long)&(reg_2.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->_vptr__Sp_counted_base + 1);
  }
  std::
  unordered_set<std::shared_ptr<mocker::ir::Reg>,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>_>
  ::unordered_set((unordered_set<std::shared_ptr<mocker::ir::Reg>,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>_>
                   *)&__range2_1);
  pBVar11 = ir::FunctionModule::getBBs_abi_cxx11_(local_20);
  __end2_1 = std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
             begin(pBVar11);
  bb = (BasicBlock *)
       std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::end
                 (pBVar11);
  while (bVar4 = std::operator!=(&__end2_1,(_Self *)&bb), bVar4) {
    this_00 = std::_List_const_iterator<mocker::ir::BasicBlock>::operator*(&__end2_1);
    this_01 = ir::BasicBlock::getInsts_abi_cxx11_(this_00);
    __end3 = std::__cxx11::
             list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
             ::begin(this_01);
    inst = (shared_ptr<mocker::ir::IRInst> *)
           std::__cxx11::
           list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
           ::end(this_01);
    while (bVar4 = std::operator!=(&__end3,(_Self *)&inst), bVar4) {
      v = std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator*(&__end3);
      ir::dyc<mocker::ir::Load,std::shared_ptr<mocker::ir::IRInst>const&>
                ((ir *)&p.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,v);
      bVar4 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr *)
                         &p.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      std::shared_ptr<mocker::ir::Load>::~shared_ptr
                ((shared_ptr<mocker::ir::Load> *)
                 &p.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      if (!bVar4) {
        ir::dyc<mocker::ir::Store,std::shared_ptr<mocker::ir::IRInst>const&>
                  ((ir *)&reg_3.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,v);
        bVar4 = std::__shared_ptr::operator_cast_to_bool
                          ((__shared_ptr *)
                           &reg_3.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        if (bVar4) {
          this_02 = std::
                    __shared_ptr_access<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&reg_3.
                                     super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount);
          addr = ir::Store::getVal(this_02);
          ir::dycGlobalReg((ir *)local_298,addr);
          bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_298);
          if (bVar4) {
            std::
            unordered_set<std::shared_ptr<mocker::ir::Reg>,mocker::ir::RegPtrHash,mocker::ir::RegPtrEqual,std::allocator<std::shared_ptr<mocker::ir::Reg>>>
            ::emplace<std::shared_ptr<mocker::ir::Reg>&>
                      ((unordered_set<std::shared_ptr<mocker::ir::Reg>,mocker::ir::RegPtrHash,mocker::ir::RegPtrEqual,std::allocator<std::shared_ptr<mocker::ir::Reg>>>
                        *)&__range2_1,(shared_ptr<mocker::ir::Reg> *)local_298);
          }
          std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_298);
          operands.
          super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0xd;
        }
        else {
          operands.
          super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        }
        std::shared_ptr<mocker::ir::Store>::~shared_ptr
                  ((shared_ptr<mocker::ir::Store> *)
                   &reg_3.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if (operands.
            super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
          ir::getOperandsUsed((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                               *)&__range4,v);
          __end4 = std::
                   vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                   ::begin((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                            *)&__range4);
          operand = (shared_ptr<mocker::ir::Addr> *)
                    std::
                    vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                    ::end((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                           *)&__range4);
          while (bVar4 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<std::shared_ptr<mocker::ir::Addr>_*,_std::vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
                                             *)&operand), bVar4) {
            reg_4.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   __gnu_cxx::
                   __normal_iterator<std::shared_ptr<mocker::ir::Addr>_*,_std::vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
                   ::operator*(&__end4);
            ir::dycGlobalReg((ir *)local_2f8,
                             (shared_ptr<mocker::ir::Addr> *)
                             reg_4.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
            bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_2f8);
            if (bVar4) {
              std::
              unordered_set<std::shared_ptr<mocker::ir::Reg>,mocker::ir::RegPtrHash,mocker::ir::RegPtrEqual,std::allocator<std::shared_ptr<mocker::ir::Reg>>>
              ::emplace<std::shared_ptr<mocker::ir::Reg>&>
                        ((unordered_set<std::shared_ptr<mocker::ir::Reg>,mocker::ir::RegPtrHash,mocker::ir::RegPtrEqual,std::allocator<std::shared_ptr<mocker::ir::Reg>>>
                          *)&__range2_1,(shared_ptr<mocker::ir::Reg> *)local_2f8);
            }
            std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_2f8);
            __gnu_cxx::
            __normal_iterator<std::shared_ptr<mocker::ir::Addr>_*,_std::vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
            ::operator++(&__end4);
          }
          std::
          vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
          ::~vector((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                     *)&__range4);
        }
      }
      std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator++(&__end3);
    }
    std::_List_const_iterator<mocker::ir::BasicBlock>::operator++(&__end2_1);
  }
  __end2_2 = std::
             unordered_set<std::shared_ptr<mocker::ir::Reg>,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>_>
             ::begin((unordered_set<std::shared_ptr<mocker::ir::Reg>,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>_>
                      *)&__range2_1);
  reg_5 = (shared_ptr<mocker::ir::Reg> *)
          std::
          unordered_set<std::shared_ptr<mocker::ir::Reg>,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>_>
          ::end((unordered_set<std::shared_ptr<mocker::ir::Reg>,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>_>
                 *)&__range2_1);
  while (bVar4 = std::__detail::operator!=
                           (&__end2_2.
                             super__Node_iterator_base<std::shared_ptr<mocker::ir::Reg>,_true>,
                            (_Node_iterator_base<std::shared_ptr<mocker::ir::Reg>,_true> *)&reg_5),
        bVar4) {
    labelAddr.super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            std::__detail::_Node_iterator<std::shared_ptr<mocker::ir::Reg>,_true,_true>::operator*
                      (&__end2_2);
    peVar10 = std::__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)labelAddr.
                            super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi);
    psVar6 = ir::Reg::getIdentifier_abi_cxx11_(peVar10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &addrReg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,"L",psVar6);
    std::make_shared<mocker::nasm::LabelAddr,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338);
    std::__cxx11::string::~string
              ((string *)
               &addrReg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    pFVar2 = func_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_388,"",(allocator<char> *)((long)&iter._M_node + 7));
    FuncSelectionContext::newVirtualReg((FuncSelectionContext *)local_368,&pFVar2->identifier);
    std::__cxx11::string::~string(local_388);
    std::allocator<char>::~allocator((allocator<char> *)((long)&iter._M_node + 7));
    nasm::Section::
    emplaceInst<mocker::nasm::Lea,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::LabelAddr>&>
              ((Section *)ctx_local,(shared_ptr<mocker::nasm::Register> *)local_368,
               (shared_ptr<mocker::nasm::LabelAddr> *)local_338);
    FuncSelectionContext::setIrRegAddr
              ((FuncSelectionContext *)func_local,
               (shared_ptr<mocker::ir::Reg> *)
               labelAddr.super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi,(shared_ptr<mocker::nasm::Register> *)local_368);
    std::shared_ptr<mocker::nasm::Register>::~shared_ptr
              ((shared_ptr<mocker::nasm::Register> *)local_368);
    std::shared_ptr<mocker::nasm::LabelAddr>::~shared_ptr
              ((shared_ptr<mocker::nasm::LabelAddr> *)local_338);
    std::__detail::_Node_iterator<std::shared_ptr<mocker::ir::Reg>,_true,_true>::operator++
              (&__end2_2);
  }
  pBVar11 = ir::FunctionModule::getBBs_abi_cxx11_(local_20);
  end = std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::begin
                  (pBVar11);
  pBVar11 = ir::FunctionModule::getBBs_abi_cxx11_(local_20);
  local_3a0._M_node =
       (_List_node_base *)
       std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::end
                 (pBVar11);
  while (bVar4 = std::operator!=(&end,&local_3a0), bVar4) {
    genBasicBlock((Section *)ctx_local,(FuncSelectionContext *)func_local,local_20,end,
                  (const_iterator)local_3a0._M_node);
    std::_List_const_iterator<mocker::ir::BasicBlock>::operator++(&end);
  }
  std::
  unordered_set<std::shared_ptr<mocker::ir::Reg>,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>_>
  ::~unordered_set((unordered_set<std::shared_ptr<mocker::ir::Reg>,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>_>
                    *)&__range2_1);
  return;
}

Assistant:

void genFunction(nasm::Section &text, FuncSelectionContext &ctx,
                 const ir::FunctionModule &func) {
  text.labelThisLine(renameIdentifier(func.getIdentifier()));
  text.emplaceInst<nasm::Push>(nasm::rbp());
  text.emplaceInst<nasm::Mov>(nasm::rbp(), nasm::rsp());

  for (auto &reg : CalleeSave) {
    if (reg->getIdentifier() == "rbp") {
      ctx.setPRegAddr(reg, reg);
      continue;
    }
    auto bak = ctx.newVirtualReg();
    text.emplaceInst<nasm::Mov>(bak, reg);
    ctx.setPRegAddr(reg, bak);
  }

  static const std::vector<std::shared_ptr<nasm::Register>> ParamRegs = {
      nasm::rdi(), nasm::rsi(), nasm::rdx(),
      nasm::rcx(), nasm::r8(),  nasm::r9()};
  for (std::size_t i = 0; i < 6 && i < func.getArgs().size(); ++i) {
    auto reg = std::make_shared<ir::Reg>(std::to_string(i));
    ctx.setIrRegAddr(reg, ctx.newVirtualReg(reg->getIdentifier()));
    text.emplaceInst<nasm::Mov>(ctx.getIrAddr(reg), ParamRegs[i]);
  }
  for (std::size_t i = 6; i < func.getArgs().size(); ++i) {
    auto reg = std::make_shared<ir::Reg>(std::to_string(i));
    auto dest = ctx.newVirtualReg(reg->getIdentifier());
    ctx.setIrRegAddr(reg, dest);
    text.emplaceInst<nasm::Mov>(
        dest, std::make_shared<nasm::MemoryAddr>(nasm::rbp(), (i - 4) * 8));
  }

  ir::RegSet globalVars;
  for (auto &bb : func.getBBs()) {
    for (auto &inst : bb.getInsts()) {
      if (ir::dyc<ir::Load>(inst))
        continue;
      if (auto p = ir::dyc<ir::Store>(inst)) {
        if (auto reg = ir::dycGlobalReg(p->getVal()))
          globalVars.emplace(reg);
        continue;
      }

      auto operands = ir::getOperandsUsed(inst);
      for (auto &operand : operands) {
        auto reg = ir::dycGlobalReg(operand);
        if (reg)
          globalVars.emplace(reg);
      }
    }
  }
  for (auto &reg : globalVars) {
    auto labelAddr =
        std::make_shared<nasm::LabelAddr>("L" + reg->getIdentifier());
    auto addrReg = ctx.newVirtualReg();
    text.emplaceInst<nasm::Lea>(addrReg, labelAddr);
    ctx.setIrRegAddr(reg, addrReg);
  }

  for (auto iter = func.getBBs().begin(), end = func.getBBs().end();
       iter != end; ++iter) {
    genBasicBlock(text, ctx, func, iter, end);
  }
}